

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

index_t __thiscall
GEO::PeriodicDelaunay3dThread::create_first_tetrahedron(PeriodicDelaunay3dThread *this)

{
  char cVar1;
  char cVar2;
  double *pdVar3;
  pointer piVar4;
  bool bVar5;
  uint uVar6;
  Sign SVar7;
  index_t iVar8;
  index_t iVar9;
  ulong uVar10;
  index_t f_1;
  index_t f;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar17;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  index_t local_5c;
  index_t t [4];
  ulong uVar16;
  
  uVar6 = this->nb_vertices_;
  if (3 < uVar6) {
    uVar13 = (this->super_Periodic).nb_vertices_non_periodic_;
    pdVar3 = this->vertices_;
    uVar10 = 1;
    if (1 < uVar13) {
      uVar10 = (ulong)uVar13;
    }
    uVar15 = 1;
    uVar18 = 3;
    while ((uVar16 = uVar10, uVar15 < uVar13 &&
           (bVar5 = PCK::points_are_identical_3d(pdVar3,pdVar3 + (uVar18 & 0xffffffff)),
           uVar16 = uVar15, bVar5))) {
      uVar15 = uVar15 + 1;
      uVar18 = uVar18 + 3;
    }
    uVar13 = (uint)uVar16;
    if (uVar13 != uVar6) {
      uVar6 = uVar13 * 3 + 6;
      uVar14 = 0;
      do {
        uVar17 = uVar14;
        uVar11 = uVar6;
        if ((this->super_Periodic).nb_vertices_non_periodic_ <= uVar13 + 1 + uVar17) break;
        pdVar3 = this->vertices_;
        bVar5 = PCK::points_are_colinear_3d(pdVar3,pdVar3 + uVar13 * 3,pdVar3 + (uVar11 - 3));
        uVar6 = uVar11 + 3;
        uVar14 = uVar17 + 1;
      } while (bVar5);
      local_5c = uVar13 + uVar17 + 1;
      if (local_5c != this->nb_vertices_) {
        iVar20 = uVar17 + 2;
        uVar17 = ~uVar17;
        uVar6 = uVar11 - 3;
        do {
          uVar14 = uVar13 + iVar20;
          if ((this->super_Periodic).nb_vertices_non_periodic_ <= uVar14) {
            if (uVar14 == this->nb_vertices_) {
              return 0xffffffff;
            }
            goto LAB_001722cf;
          }
          pdVar3 = this->vertices_;
          SVar7 = PCK::orient_3d(pdVar3,pdVar3 + uVar13 * 3,pdVar3 + uVar6,pdVar3 + uVar11);
          iVar20 = iVar20 + 1;
          uVar17 = uVar17 - 1;
          uVar11 = uVar11 + 3;
        } while (SVar7 == ZERO);
        if (uVar13 - this->nb_vertices_ == uVar17) {
          return 0xffffffff;
        }
        uVar14 = uVar13 - uVar17;
        if (SVar7 == NEGATIVE) {
          uVar14 = local_5c;
          local_5c = uVar13 - uVar17;
        }
LAB_001722cf:
        iVar8 = new_tetrahedron(this,0,uVar13,local_5c,uVar14);
        uVar6 = iVar8 * 4;
        pcVar19 = &DAT_001b1942;
        for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
          piVar4 = (this->cell_to_v_store_->
                   super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar9 = new_tetrahedron(this,-1,piVar4[(int)*pcVar19 + uVar6],
                                  piVar4[(int)pcVar19[-1] + uVar6],piVar4[(int)pcVar19[-2] + uVar6])
          ;
          t[lVar12] = iVar9;
          pcVar19 = pcVar19 + 3;
        }
        piVar4 = (this->cell_to_cell_store_->
                 super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                 super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
          iVar9 = t[lVar12];
          piVar4[iVar9 * 4] = iVar8;
          piVar4[(ulong)uVar6 + lVar12] = iVar9;
        }
        pcVar19 = &DAT_001b1942;
        for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
          cVar1 = pcVar19[-1];
          cVar2 = pcVar19[-2];
          uVar10 = (ulong)(t[lVar12] << 2);
          piVar4[uVar10 + 1] = t[(uint)(int)*pcVar19];
          piVar4[uVar10 + 2] = t[(long)cVar1 & 0xffffffff];
          piVar4[uVar10 + 3] = t[(long)cVar2 & 0xffffffff];
          pcVar19 = pcVar19 + 3;
        }
        this->v1_ = 0;
        this->v2_ = uVar13;
        this->v3_ = local_5c;
        this->v4_ = uVar14;
        release_tets(this);
        return iVar8;
      }
    }
  }
  return 0xffffffff;
}

Assistant:

index_t nb_vertices() const {
            return nb_vertices_;
        }